

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rlgl.h
# Opt level: O2

void rlVertex3f(float x,float y,float z)

{
  int *piVar1;
  int iVar2;
  VertexBuffer *pVVar3;
  Matrix mat;
  Vector3 VVar4;
  
  VVar4._0_8_ = CONCAT44(y,x);
  if (RLGL.State.transformRequired) {
    mat._8_8_ = RLGL.State.transform._8_8_;
    mat._0_8_ = RLGL.State.transform._0_8_;
    mat._16_8_ = RLGL.State.transform._16_8_;
    mat._24_8_ = RLGL.State.transform._24_8_;
    mat._32_8_ = RLGL.State.transform._32_8_;
    mat._40_8_ = RLGL.State.transform._40_8_;
    mat._48_8_ = RLGL.State.transform._48_8_;
    mat._56_8_ = RLGL.State.transform._56_8_;
    VVar4.z = z;
    VVar4 = Vector3Transform(VVar4,mat);
    z = VVar4.z;
  }
  pVVar3 = (RLGL.currentBatch)->vertexBuffer;
  iVar2 = (RLGL.currentBatch)->currentBuffer;
  if (pVVar3[iVar2].vCounter < pVVar3[iVar2].elementsCount * 4) {
    pVVar3[iVar2].vertices[(long)pVVar3[iVar2].vCounter * 3] = (float)VVar4._0_8_;
    (RLGL.currentBatch)->vertexBuffer[(RLGL.currentBatch)->currentBuffer].vertices
    [(long)(RLGL.currentBatch)->vertexBuffer[(RLGL.currentBatch)->currentBuffer].vCounter * 3 + 1] =
         (float)((ulong)VVar4._0_8_ >> 0x20);
    (RLGL.currentBatch)->vertexBuffer[(RLGL.currentBatch)->currentBuffer].vertices
    [(long)(RLGL.currentBatch)->vertexBuffer[(RLGL.currentBatch)->currentBuffer].vCounter * 3 + 2] =
         z;
    piVar1 = &(RLGL.currentBatch)->vertexBuffer[(RLGL.currentBatch)->currentBuffer].vCounter;
    *piVar1 = *piVar1 + 1;
    piVar1 = &(RLGL.currentBatch)->draws[(long)(RLGL.currentBatch)->drawsCounter + -1].vertexCount;
    *piVar1 = *piVar1 + 1;
    return;
  }
  TraceLog(5,"RLGL: Batch elements overflow");
  return;
}

Assistant:

void rlVertex3f(float x, float y, float z)
{
    Vector3 vec = { x, y, z };

    // Transform provided vector if required
    if (RLGL.State.transformRequired) vec = Vector3Transform(vec, RLGL.State.transform);

    // Verify that current vertex buffer elements limit has not been reached
    if (RLGL.currentBatch->vertexBuffer[RLGL.currentBatch->currentBuffer].vCounter < (RLGL.currentBatch->vertexBuffer[RLGL.currentBatch->currentBuffer].elementsCount*4))
    {
        RLGL.currentBatch->vertexBuffer[RLGL.currentBatch->currentBuffer].vertices[3*RLGL.currentBatch->vertexBuffer[RLGL.currentBatch->currentBuffer].vCounter] = vec.x;
        RLGL.currentBatch->vertexBuffer[RLGL.currentBatch->currentBuffer].vertices[3*RLGL.currentBatch->vertexBuffer[RLGL.currentBatch->currentBuffer].vCounter + 1] = vec.y;
        RLGL.currentBatch->vertexBuffer[RLGL.currentBatch->currentBuffer].vertices[3*RLGL.currentBatch->vertexBuffer[RLGL.currentBatch->currentBuffer].vCounter + 2] = vec.z;
        RLGL.currentBatch->vertexBuffer[RLGL.currentBatch->currentBuffer].vCounter++;

        RLGL.currentBatch->draws[RLGL.currentBatch->drawsCounter - 1].vertexCount++;
    }
    else TRACELOG(LOG_ERROR, "RLGL: Batch elements overflow");
}